

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O1

string * IntToStr_abi_cxx11_(string *__return_storage_ptr__,int pos)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string IntToStr (const int pos){
	int row = GetRow (pos);
	int col = GetCol(pos);
	std::string s = "";
	s += (char) (col - 3 + 'a');
	s += (char) (row + P1[row] + '0');
	return s;
}